

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O0

int fy_node_insert(fy_node *fyn_to,fy_node *fyn_from)

{
  fy_document *fyd_00;
  _Bool _Var1;
  byte bVar2;
  int iVar3;
  fy_node *_n;
  fy_node *_p;
  fy_node *pfVar4;
  fy_node_pair *pfVar5;
  fy_node_pair *pfStack_60;
  int rc;
  fy_node_pair *fynpj;
  fy_node_pair *fynpi;
  fy_node_pair *fynp;
  fy_node *fyn_prev;
  fy_node *fyni;
  fy_node *fyn_cpy;
  fy_node *fyn_parent;
  fy_document *fyd;
  fy_node *fyn_from_local;
  fy_node *fyn_to_local;
  
  if ((fyn_to == (fy_node *)0x0) || (fyn_to->fyd == (fy_document *)0x0)) {
    return -1;
  }
  fyd_00 = fyn_to->fyd;
  if (fyd_00 == (fy_document *)0x0) {
    __assert_fail("fyd",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                  ,0x7f3,"int fy_node_insert(struct fy_node *, struct fy_node *)");
  }
  pfVar4 = fyn_to->parent;
  fynpi = (fy_node_pair *)0x0;
  if (pfVar4 != (fy_node *)0x0) {
    if ((pfVar4->field_0x34 & 3) == 0) {
      fy_document_diag(fyd_00,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                       ,0x7f9,"fy_node_insert","Illegal scalar parent node type");
      return -1;
    }
    if (fyn_from == (fy_node *)0x0) {
      fy_document_diag(fyd_00,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                       ,0x7fc,"fy_node_insert","Illegal NULL source node");
      return -1;
    }
    if ((pfVar4->field_0x34 & 3) == 2) {
      for (fynpi = fy_node_pair_list_head(&(pfVar4->field_12).mapping);
          (fynpi != (fy_node_pair *)0x0 && (fynpi->value != fyn_to));
          fynpi = fy_node_pair_next(&(pfVar4->field_12).mapping,fynpi)) {
      }
    }
  }
  if ((pfVar4 == (fy_node *)0x0) && (fyn_to != fyd_00->root)) {
    __assert_fail("fyn_parent || fyn_to == fyd->root",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                  ,0x809,"int fy_node_insert(struct fy_node *, struct fy_node *)");
  }
  if (fyn_from == (fy_node *)0x0) {
    fyn_to->parent = (fy_node *)0x0;
    if (pfVar4 == (fy_node *)0x0) {
      fy_document_diag(fyd_00,0x40,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                       ,0x810,"fy_node_insert","Deleting root node");
      fy_node_detach_and_free(fyn_to);
      fyd_00->root = (fy_node *)0x0;
      return 0;
    }
    if ((pfVar4->field_0x34 & 3) == 1) {
      fy_document_diag(fyd_00,0x40,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                       ,0x814,"fy_node_insert","Deleting sequence node");
      fy_node_list_del(&(pfVar4->field_12).sequence,fyn_to);
      fy_node_detach_and_free(fyn_to);
      return 0;
    }
    fy_document_diag(fyd_00,0x40,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                     ,0x818,"fy_node_insert","Deleting mapping node");
    if ((pfVar4->field_0x34 & 3) != 2) {
      __assert_fail("fyn_parent->type == FYNT_MAPPING",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                    ,0x81a,"int fy_node_insert(struct fy_node *, struct fy_node *)");
    }
    if (fynpi != (fy_node_pair *)0x0) {
      fy_node_pair_list_del(&(pfVar4->field_12).mapping,fynpi);
      if (pfVar4->xl != (fy_accel *)0x0) {
        fy_accel_remove(pfVar4->xl,fynpi->key);
      }
      fy_node_pair_detach_and_free(fynpi);
      return 0;
    }
    fy_document_diag(fyd_00,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                     ,0x81d,"fy_node_insert","Illegal mapping node found");
  }
  else {
    if (((fyn_from->field_0x34 & 3) == (fyn_to->field_0x34 & 3)) &&
       ((fyn_from->field_0x34 & 3) != 0)) {
      if ((fyn_to->field_0x34 & 3) == 1) {
        fy_document_diag(fyd_00,0x40,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                         ,0x86b,"fy_node_insert","Appending to sequence node");
        for (fyn_prev = fy_node_list_head(&(fyn_from->field_12).sequence);
            fyn_prev != (fy_node *)0x0;
            fyn_prev = fy_node_next(&(fyn_from->field_12).sequence,fyn_prev)) {
          pfVar4 = fy_node_copy(fyd_00,fyn_prev);
          if (pfVar4 == (fy_node *)0x0) {
            fy_document_diag(fyd_00,4,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                             ,0x872,"fy_node_insert","fy_node_copy() failed");
            return -1;
          }
          fy_node_list_add_tail(&(fyn_to->field_12).sequence,pfVar4);
          pfVar4->field_0x34 = pfVar4->field_0x34 & 0xf7 | 8;
        }
      }
      else {
        for (fynpj = fy_node_pair_list_head(&(fyn_from->field_12).mapping);
            fynpj != (fy_node_pair *)0x0;
            fynpj = fy_node_pair_next(&(fyn_from->field_12).mapping,fynpj)) {
          if (fyn_to->xl == (fy_accel *)0x0) {
            pfStack_60 = fy_node_pair_list_head(&(fyn_to->field_12).mapping);
            while ((pfStack_60 != (fy_node_pair *)0x0 &&
                   (_Var1 = fy_node_compare(fynpj->key,pfStack_60->key), !_Var1))) {
              pfStack_60 = fy_node_pair_next(&(fyn_to->field_12).mapping,pfStack_60);
            }
          }
          else {
            pfStack_60 = fy_node_accel_lookup_by_node(fyn_to,fynpj->key);
          }
          if (pfStack_60 == (fy_node_pair *)0x0) {
            fy_document_diag(fyd_00,0x40,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                             ,0x88b,"fy_node_insert","Appending to mapping node");
            pfVar5 = fy_node_pair_alloc(fyd_00);
            if (pfVar5 == (fy_node_pair *)0x0) {
              fy_document_diag(fyd_00,4,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                               ,0x890,"fy_node_insert","fy_node_pair_alloc() failed");
              return -1;
            }
            pfVar4 = fy_node_copy(fyd_00,fynpj->key);
            pfVar5->key = pfVar4;
            if ((fynpj->key != (fy_node *)0x0) && (pfVar5->key == (fy_node *)0x0)) {
              fy_document_diag(fyd_00,4,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                               ,0x894,"fy_node_insert","fy_node_copy() failed");
              return -1;
            }
            pfVar4 = fy_node_copy(fyd_00,fynpj->value);
            pfVar5->value = pfVar4;
            if ((fynpj->value != (fy_node *)0x0) && (pfVar5->value == (fy_node *)0x0)) {
              fy_document_diag(fyd_00,4,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                               ,0x897,"fy_node_insert","fy_node_copy() failed");
              return -1;
            }
            fy_node_pair_list_add_tail(&(fyn_to->field_12).mapping,pfVar5);
            if (fyn_to->xl != (fy_accel *)0x0) {
              fy_accel_insert(fyn_to->xl,pfVar5->key,pfVar5);
            }
            if (pfVar5->key != (fy_node *)0x0) {
              pfVar5->key->field_0x34 = pfVar5->key->field_0x34 & 0xf7 | 8;
            }
            if (pfVar5->value != (fy_node *)0x0) {
              pfVar5->value->field_0x34 = pfVar5->value->field_0x34 & 0xf7 | 8;
            }
          }
          else {
            fy_document_diag(fyd_00,0x40,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                             ,0x8a3,"fy_node_insert","Updating mapping node value (deep merge)");
            iVar3 = fy_node_insert(pfStack_60->value,fynpj->value);
            if (iVar3 != 0) {
              fy_document_diag(fyd_00,4,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                               ,0x8a7,"fy_node_insert","fy_node_insert() failed");
              return iVar3;
            }
          }
        }
      }
      bVar2 = fyn_to->field_0x34 & 3;
      if ((fyn_to->field_0x34 & 3) != 0) {
        if (bVar2 == 1) {
          for (fyn_prev = fy_node_list_head(&(fyn_to->field_12).sequence);
              fyn_prev != (fy_node *)0x0;
              fyn_prev = fy_node_next(&(fyn_to->field_12).sequence,fyn_prev)) {
            fyn_prev->parent = fyn_to;
          }
        }
        else if (bVar2 == 2) {
          fynpi = fy_node_pair_list_head(&(fyn_to->field_12).mapping);
          while (fynpi != (fy_node_pair *)0x0) {
            pfVar5 = fy_node_pair_next(&(fyn_to->field_12).mapping,fynpi);
            if (fynpi->key != (fy_node *)0x0) {
              fynpi->key->parent = (fy_node *)0x0;
            }
            if (fynpi->value != (fy_node *)0x0) {
              fynpi->value->parent = fyn_to;
            }
            fynpi->parent = fyn_to;
            fynpi = pfVar5;
          }
        }
      }
      if (fyn_to->fyd == fyn_from->fyd) {
        return 0;
      }
      iVar3 = fy_document_state_merge(fyn_to->fyd->fyds,fyn_from->fyd->fyds);
      if (iVar3 != 0) {
        fy_document_diag(fyd_00,4,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                         ,0x8cb,"fy_node_insert","fy_document_state_merge() failed");
        return iVar3;
      }
      pfVar4 = fy_document_root(fyd_00);
      iVar3 = fy_document_node_update_tags(fyd_00,pfVar4);
      if (iVar3 == 0) {
        return 0;
      }
      fy_document_diag(fyd_00,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                       ,0x8cf,"fy_node_insert","fy_document_node_update_tags() failed");
      return iVar3;
    }
    _n = fy_node_copy(fyd_00,fyn_from);
    if (_n == (fy_node *)0x0) {
      fy_document_diag(fyd_00,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                       ,0x845,"fy_node_insert","fy_node_copy() failed");
    }
    else {
      if (pfVar4 == (fy_node *)0x0) {
        fy_document_diag(fyd_00,0x40,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                         ,0x848,"fy_node_insert","Replacing root node");
        fy_node_detach_and_free(fyd_00->root);
        fyd_00->root = _n;
        return 0;
      }
      if ((pfVar4->field_0x34 & 3) == 1) {
        fy_document_diag(fyd_00,0x40,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                         ,0x84c,"fy_node_insert","Replacing sequence node");
        _p = fy_node_prev(&(pfVar4->field_12).sequence,fyn_to);
        fy_node_list_del(&(pfVar4->field_12).sequence,fyn_to);
        fy_node_detach_and_free(fyn_to);
        if (_p != (fy_node *)0x0) {
          fy_node_list_insert_after(&(pfVar4->field_12).sequence,_p,_n);
          return 0;
        }
        fy_node_list_add(&(pfVar4->field_12).sequence,_n);
        return 0;
      }
      fy_document_diag(fyd_00,0x40,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                       ,0x85b,"fy_node_insert","Replacing mapping node value");
      if ((pfVar4->field_0x34 & 3) != 2) {
        __assert_fail("fyn_parent->type == FYNT_MAPPING",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                      ,0x85d,"int fy_node_insert(struct fy_node *, struct fy_node *)");
      }
      if (fynpi != (fy_node_pair *)0x0) {
        fy_node_detach_and_free(fynpi->value);
        fynpi->value = _n;
        return 0;
      }
      fy_document_diag(fyd_00,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                       ,0x85f,"fy_node_insert","Illegal mapping node found");
    }
  }
  return -1;
}

Assistant:

int fy_node_insert(struct fy_node *fyn_to, struct fy_node *fyn_from) {
    struct fy_document *fyd;
    struct fy_node *fyn_parent, *fyn_cpy, *fyni, *fyn_prev;
    struct fy_node_pair *fynp, *fynpi, *fynpj;
    int rc;

    if (!fyn_to || !fyn_to->fyd)
        return -1;

    fyd = fyn_to->fyd;
    assert(fyd);

    fyn_parent = fyn_to->parent;
    fynp = NULL;
    if (fyn_parent) {
        fyd_error_check(fyd, fyn_parent->type != FYNT_SCALAR, err_out,
                        "Illegal scalar parent node type");

        fyd_error_check(fyd, fyn_from, err_out,
                        "Illegal NULL source node");

        if (fyn_parent->type == FYNT_MAPPING) {
            /* find mapping pair that contains the `to` node */
            for (fynp = fy_node_pair_list_head(&fyn_parent->mapping); fynp;
                 fynp = fy_node_pair_next(&fyn_parent->mapping, fynp)) {
                if (fynp->value == fyn_to)
                    break;
            }
        }
    }

    /* verify no funkiness on root */
    assert(fyn_parent || fyn_to == fyd->root);

    /* deleting target */
    if (!fyn_from) {
        fyn_to->parent = NULL;

        if (!fyn_parent) {
            fyd_doc_debug(fyd, "Deleting root node");
            fy_node_detach_and_free(fyn_to);
            fyd->root = NULL;
        } else if (fyn_parent->type == FYNT_SEQUENCE) {
            fyd_doc_debug(fyd, "Deleting sequence node");
            fy_node_list_del(&fyn_parent->sequence, fyn_to);
            fy_node_detach_and_free(fyn_to);
        } else {
            fyd_doc_debug(fyd, "Deleting mapping node");
            /* should never happen, it's checked right above, but play safe */
            assert(fyn_parent->type == FYNT_MAPPING);

            fyd_error_check(fyd, fynp, err_out,
                            "Illegal mapping node found");

            fy_node_pair_list_del(&fyn_parent->mapping, fynp);
            if (fyn_parent->xl)
                fy_accel_remove(fyn_parent->xl, fynp->key);
            /* this will also delete fyn_to */
            fy_node_pair_detach_and_free(fynp);
        }
        return 0;
    }

    /*
	 * from: scalar
	 *
	 * to: another-scalar -> scalar
	 * to: { key: value } -> scalar
	 * to: [ seq0, seq1 ] -> scalar
	 *
	 * from: [ seq2 ]
	 * to: scalar -> [ seq2 ]
	 * to: { key: value } -> [ seq2 ]
	 * to: [ seq0, seq1 ] -> [ seq0, seq1, sec2 ]
	 *
	 * from: { another-key: another-value }
	 * to: scalar -> { another-key: another-value }
	 * to: { key: value } -> { key: value, another-key: another-value }
	 * to: [ seq0, seq1 ] -> { another-key: another-value }
	 *
	 * from: { key: another-value }
	 * to: scalar -> { key: another-value }
	 * to: { key: value } -> { key: another-value }
	 * to: [ seq0, seq1 ] -> { key: another-value }
	 *
	 */

    /* if types of `from` and `to` differ (or it's a scalar), it's a replace */
    if (fyn_from->type != fyn_to->type || fyn_from->type == FYNT_SCALAR) {

        fyn_cpy = fy_node_copy(fyd, fyn_from);
        fyd_error_check(fyd, fyn_cpy, err_out,
                        "fy_node_copy() failed");

        if (!fyn_parent) {
            fyd_doc_debug(fyd, "Replacing root node");
            fy_node_detach_and_free(fyd->root);
            fyd->root = fyn_cpy;
        } else if (fyn_parent->type == FYNT_SEQUENCE) {
            fyd_doc_debug(fyd, "Replacing sequence node");

            /* get previous */
            fyn_prev = fy_node_prev(&fyn_parent->sequence, fyn_to);

            /* delete */
            fy_node_list_del(&fyn_parent->sequence, fyn_to);
            fy_node_detach_and_free(fyn_to);

            /* if there's no previous insert to head */
            if (!fyn_prev)
                fy_node_list_add(&fyn_parent->sequence, fyn_cpy);
            else
                fy_node_list_insert_after(&fyn_parent->sequence, fyn_prev, fyn_cpy);
        } else {
            fyd_doc_debug(fyd, "Replacing mapping node value");
            /* should never happen, it's checked right above, but play safe */
            assert(fyn_parent->type == FYNT_MAPPING);
            fyd_error_check(fyd, fynp, err_out,
                            "Illegal mapping node found");

            fy_node_detach_and_free(fynp->value);
            fynp->value = fyn_cpy;
        }

        return 0;
    }

    /* types match, if it's a sequence append */
    if (fyn_to->type == FYNT_SEQUENCE) {

        fyd_doc_debug(fyd, "Appending to sequence node");

        for (fyni = fy_node_list_head(&fyn_from->sequence); fyni;
             fyni = fy_node_next(&fyn_from->sequence, fyni)) {

            fyn_cpy = fy_node_copy(fyd, fyni);
            fyd_error_check(fyd, fyn_cpy, err_out,
                            "fy_node_copy() failed");

            fy_node_list_add_tail(&fyn_to->sequence, fyn_cpy);
            fyn_cpy->attached = true;
        }
    } else {
        /* only mapping is possible here */

        /* iterate over all the keys in the `from` */
        for (fynpi = fy_node_pair_list_head(&fyn_from->mapping); fynpi;
             fynpi = fy_node_pair_next(&fyn_from->mapping, fynpi)) {

            if (fyn_to->xl) {
                fynpj = fy_node_accel_lookup_by_node(fyn_to, fynpi->key);
            } else {
                /* find whether the key already exists */
                for (fynpj = fy_node_pair_list_head(&fyn_to->mapping); fynpj;
                     fynpj = fy_node_pair_next(&fyn_to->mapping, fynpj)) {

                    if (fy_node_compare(fynpi->key, fynpj->key))
                        break;
                }
            }

            if (!fynpj) {
                fyd_doc_debug(fyd, "Appending to mapping node");

                /* not found? append it */
                fynpj = fy_node_pair_alloc(fyd);
                fyd_error_check(fyd, fynpj, err_out,
                                "fy_node_pair_alloc() failed");

                fynpj->key = fy_node_copy(fyd, fynpi->key);
                fyd_error_check(fyd, !fynpi->key || fynpj->key, err_out,
                                "fy_node_copy() failed");
                fynpj->value = fy_node_copy(fyd, fynpi->value);
                fyd_error_check(fyd, !fynpi->value || fynpj->value, err_out,
                                "fy_node_copy() failed");

                fy_node_pair_list_add_tail(&fyn_to->mapping, fynpj);
                if (fyn_to->xl)
                    fy_accel_insert(fyn_to->xl, fynpj->key, fynpj);

                if (fynpj->key)
                    fynpj->key->attached = true;
                if (fynpj->value)
                    fynpj->value->attached = true;

            } else {
                fyd_doc_debug(fyd, "Updating mapping node value (deep merge)");

                rc = fy_node_insert(fynpj->value, fynpi->value);
                fyd_error_check(fyd, !rc, err_out_rc,
                                "fy_node_insert() failed");
            }
        }
    }

    /* adjust parents */
    switch (fyn_to->type) {
        case FYNT_SCALAR:
            break;

        case FYNT_SEQUENCE:
            for (fyni = fy_node_list_head(&fyn_to->sequence); fyni;
                 fyni = fy_node_next(&fyn_to->sequence, fyni)) {

                fyni->parent = fyn_to;
            }
            break;

        case FYNT_MAPPING:
            for (fynp = fy_node_pair_list_head(&fyn_to->mapping); fynp; fynp = fynpi) {

                fynpi = fy_node_pair_next(&fyn_to->mapping, fynp);

                if (fynp->key)
                    fynp->key->parent = NULL;
                if (fynp->value)
                    fynp->value->parent = fyn_to;
                fynp->parent = fyn_to;
            }
            break;
    }

    /* if the documents differ, merge their states */
    if (fyn_to->fyd != fyn_from->fyd) {
        rc = fy_document_state_merge(fyn_to->fyd->fyds, fyn_from->fyd->fyds);
        fyd_error_check(fyd, !rc, err_out_rc,
                        "fy_document_state_merge() failed");

        rc = fy_document_node_update_tags(fyd, fy_document_root(fyd));
        fyd_error_check(fyd, !rc, err_out_rc,
                        "fy_document_node_update_tags() failed");
    }

    return 0;

    err_out:
    rc = -1;
    err_out_rc:
    return rc;
}